

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym2413.c
# Opt level: O2

void chan_calc(OPL3 *chip,OPL3_CH *CH)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  int iVar7;
  uint uVar8;
  
  if (CH->Muted != '\0') {
    return;
  }
  chip->phase_modulation = 0;
  chip->phase_modulation2 = 0;
  iVar7 = CH->SLOT[0].volume;
  iVar2 = CH->SLOT[0].TLL;
  uVar8 = CH->SLOT[0].AMmask;
  uVar3 = chip->LFO_AM;
  iVar4 = CH->SLOT[0].op1_out[0];
  iVar5 = CH->SLOT[0].op1_out[1];
  CH->SLOT[0].op1_out[0] = iVar5;
  CH->SLOT[0].op1_out[1] = 0;
  uVar8 = (uVar8 & uVar3) + iVar7 + iVar2;
  iVar7 = 0;
  if (uVar8 < 0x1a0) {
    bVar1 = CH->SLOT[0].FB;
    iVar7 = 0;
    if (bVar1 != 0) {
      iVar7 = iVar5 + iVar4;
    }
    iVar7 = op_calc1(CH->SLOT[0].Cnt,uVar8,iVar7 << (bVar1 & 0x1f),CH->SLOT[0].wavetable);
    CH->SLOT[0].op1_out[1] = iVar7;
  }
  piVar6 = CH->SLOT[0].connect;
  *piVar6 = *piVar6 + iVar7;
  uVar8 = (CH->SLOT[1].AMmask & chip->LFO_AM) + CH->SLOT[1].volume + CH->SLOT[1].TLL;
  if (uVar8 < 0x1a0) {
    iVar7 = op_calc(CH->SLOT[1].Cnt,uVar8,chip->phase_modulation,CH->SLOT[1].wavetable);
    piVar6 = CH->SLOT[1].connect;
    *piVar6 = *piVar6 + iVar7;
  }
  return;
}

Assistant:

INLINE void chan_calc( YM2413*chip, OPLL_CH *CH )
{
	OPLL_SLOT *SLOT;
	unsigned int env;
	signed int out;
	signed int phase_modulation;    /* phase modulation input (SLOT 2) */


	if (CH->Muted)
		return;

	/* SLOT 1 */
	SLOT = &CH->SLOT[SLOT1];
	env  = volume_calc(SLOT);
	out  = SLOT->op1_out[0] + SLOT->op1_out[1];

	SLOT->op1_out[0] = SLOT->op1_out[1];
	phase_modulation = SLOT->op1_out[0];

	SLOT->op1_out[1] = 0;

	if( env < ENV_QUIET )
	{
		if (!SLOT->fb_shift)
			out = 0;
		SLOT->op1_out[1] = op_calc1(SLOT->phase, env, (out<<SLOT->fb_shift), SLOT->wavetable );
	}

	/* SLOT 2 */
	SLOT++;
	env = volume_calc(SLOT);
	if( env < ENV_QUIET )
	{
		chip->output[0] += op_calc(SLOT->phase, env, phase_modulation, SLOT->wavetable);
	}
}